

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void compact_suite::test_float64(void)

{
  value vVar1;
  size_type sVar2;
  array<double,_3UL> buffer;
  undefined1 local_e0 [8];
  value_type expected_literal [24];
  undefined8 local_c0;
  size_type local_b8;
  reader reader;
  value_type input [26];
  
  input[0x10] = '\0';
  input[0x11] = '@';
  input[0x12] = '\0';
  input[0x13] = '\0';
  input[0x14] = '\0';
  input[0x15] = '\0';
  input[0x16] = '\0';
  input[0x17] = '\0';
  input[0x18] = '\b';
  input[0x19] = '@';
  input[0] = 0xaf;
  input[1] = '\x18';
  input[2] = '\0';
  input[3] = '\0';
  input[4] = '\0';
  input[5] = '\0';
  input[6] = '\0';
  input[7] = '\0';
  input[8] = 0xf0;
  input[9] = '?';
  input[10] = '\0';
  input[0xb] = '\0';
  input[0xc] = '\0';
  input[0xd] = '\0';
  input[0xe] = '\0';
  input[0xf] = '\0';
  trial::protocol::bintoken::reader::reader<unsigned_char[26]>(&reader,&input);
  buffer._M_elems[0] = (double)CONCAT44(buffer._M_elems[0]._4_4_,0xaf);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::array8_float64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x476,"void compact_suite::test_float64()",expected_literal,&buffer);
  expected_literal._0_4_ =
       trial::protocol::bintoken::token::symbol::convert(reader.decoder.current.code);
  buffer._M_elems[0] = (double)CONCAT44(buffer._M_elems[0]._4_4_,7);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x477,"void compact_suite::test_float64()",expected_literal,&buffer);
  vVar1 = trial::protocol::bintoken::detail::decoder::category(&reader.decoder);
  expected_literal[0] = (char)vVar1;
  expected_literal[1] = (char)(vVar1 >> 8);
  expected_literal[2] = (char)(vVar1 >> 0x10);
  expected_literal[3] = (char)(vVar1 >> 0x18);
  buffer._M_elems[0] = (double)CONCAT44(buffer._M_elems[0]._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x478,"void compact_suite::test_float64()",expected_literal,&buffer);
  sVar2 = trial::protocol::bintoken::reader::length(&reader);
  boost::detail::test_impl
            ("reader.length() == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x479,"void compact_suite::test_float64()",sVar2 == 3);
  expected_literal[0] = '\0';
  expected_literal[1] = '\0';
  expected_literal[2] = '\0';
  expected_literal[3] = '\0';
  expected_literal[4] = '\0';
  expected_literal[5] = '\0';
  expected_literal[6] = 0xf0;
  expected_literal[7] = '?';
  expected_literal[8] = '\0';
  expected_literal[9] = '\0';
  expected_literal[10] = '\0';
  expected_literal[0xb] = '\0';
  expected_literal[0xc] = '\0';
  expected_literal[0xd] = '\0';
  expected_literal[0xe] = '\0';
  expected_literal[0xf] = '@';
  expected_literal[0x10] = '\0';
  expected_literal[0x11] = '\0';
  expected_literal[0x12] = '\0';
  expected_literal[0x13] = '\0';
  expected_literal[0x14] = '\0';
  expected_literal[0x15] = '\0';
  expected_literal[0x16] = '\b';
  expected_literal[0x17] = '@';
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x481,"void compact_suite::test_float64()",reader.decoder.current.view._M_str,
             reader.decoder.current.view._M_str + reader.decoder.current.view._M_len,
             expected_literal,&local_c0);
  expected_literal[0] = '\0';
  expected_literal[1] = '\0';
  expected_literal[2] = '\0';
  expected_literal[3] = '\0';
  expected_literal[4] = '\0';
  expected_literal[5] = '\0';
  expected_literal[6] = 0xf0;
  expected_literal[7] = '?';
  expected_literal[8] = '\0';
  expected_literal[9] = '\0';
  expected_literal[10] = '\0';
  expected_literal[0xb] = '\0';
  expected_literal[0xc] = '\0';
  expected_literal[0xd] = '\0';
  expected_literal[0xe] = '\0';
  expected_literal[0xf] = '@';
  expected_literal[0x10] = '\0';
  expected_literal[0x11] = '\0';
  expected_literal[0x12] = '\0';
  expected_literal[0x13] = '\0';
  expected_literal[0x14] = '\0';
  expected_literal[0x15] = '\0';
  expected_literal[0x16] = '\b';
  expected_literal[0x17] = '@';
  buffer._M_elems[0] = 0.0;
  buffer._M_elems[1] = 0.0;
  buffer._M_elems[2] = 0.0;
  local_b8 = trial::protocol::bintoken::reader::overloader<double,_void>::convert
                       (&reader,buffer._M_elems,3);
  local_c0 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("reader.array<token::float64::type>(buffer.data(), buffer.size())","buffer.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x489,"void compact_suite::test_float64()",&local_b8,&local_c0);
  boost::detail::test_all_with_impl<std::ostream,double*,double_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x48c,"void compact_suite::test_float64()",&buffer,local_e0,expected_literal,&local_c0
            );
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&reader.stack);
  return;
}

Assistant:

void test_float64()
{
    const value_type input[] = {
        token::code::array8_float64, 3 * token::float64::size,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x40,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::array8_float64);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 3);
    {
        const value_type expected_literal[] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x40,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40 };
        TRIAL_PROTOCOL_TEST_ALL_WITH(reader.literal().begin(), reader.literal().end(),
                                     expected_literal, expected_literal + sizeof(expected_literal),
                                     std::equal_to<value_type>());
    }
    {
        const std::array<token::float64::type, 3> expected = {{
                1.0,
                2.0,
                3.0 }};
        std::array<token::float64::type, expected.size()> buffer = {};
        TRIAL_PROTOCOL_TEST_EQUAL(reader.array<token::float64::type>(buffer.data(), buffer.size()), buffer.size());
        TRIAL_PROTOCOL_TEST_ALL_WITH(buffer.begin(), buffer.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<value_type>());
    }
}